

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_file.cpp
# Opt level: O2

PAL_ERROR CorUnix::InternalGetFileType(CPalThread *pThread,HANDLE hFile,DWORD *pdwFileType)

{
  PAL_ERROR PVar1;
  int iVar2;
  undefined1 local_c8 [8];
  stat stat_data;
  CFileProcessLocalData *pLocalData;
  IDataLock *pLocalDataLock;
  IPalObject *pFileObject;
  
  pLocalDataLock = (IDataLock *)0x0;
  stat_data.__glibc_reserved[2] = 0;
  pLocalData = (CFileProcessLocalData *)0x0;
  if (hFile == (HANDLE)0xffffffffffffffff) {
    if (!PAL_InitializeChakraCoreCalled) goto LAB_00321bd5;
    PVar1 = 6;
  }
  else {
    PVar1 = (**(code **)(*g_pObjectManager + 0x28))
                      (g_pObjectManager,pThread,hFile,aotFile,0x80000000,&pLocalDataLock);
    if ((PVar1 == 0) &&
       (PVar1 = (*pLocalDataLock->_vptr_IDataLock[3])
                          (pLocalDataLock,pThread,0,&pLocalData,stat_data.__glibc_reserved + 2),
       PVar1 == 0)) {
      if (*(int *)(stat_data.__glibc_reserved[2] + 0x14) == 1) {
        if (PAL_InitializeChakraCoreCalled == false) goto LAB_00321bd5;
        PVar1 = 5;
      }
      else {
        iVar2 = fstat64(*(int *)(stat_data.__glibc_reserved[2] + 8),(stat64 *)local_c8);
        if (iVar2 == 0) {
          if (PAL_InitializeChakraCoreCalled == false) {
LAB_00321bd5:
            abort();
          }
          switch(((uint)stat_data.st_nlink & 0xf000) - 0x1000 >> 0xc) {
          case 0:
            *pdwFileType = 3;
            break;
          case 1:
            *pdwFileType = 2;
            break;
          default:
            *pdwFileType = 0;
            break;
          case 3:
          case 7:
            *pdwFileType = 1;
          }
          PVar1 = 0;
        }
        else {
          if (PAL_InitializeChakraCoreCalled == false) goto LAB_00321bd5;
          PVar1 = FILEGetLastErrorFromErrno();
        }
      }
    }
  }
  if (pLocalData != (CFileProcessLocalData *)0x0) {
    (*(code *)pLocalData->pLockController->_vptr_IFileLockController)(pLocalData,pThread,0);
  }
  if (pLocalDataLock != (IDataLock *)0x0) {
    (*pLocalDataLock->_vptr_IDataLock[8])(pLocalDataLock,pThread);
  }
  return PVar1;
}

Assistant:

PAL_ERROR
CorUnix::InternalGetFileType(
    CPalThread *pThread,
    HANDLE hFile,
    DWORD *pdwFileType
    )
{
    PAL_ERROR palError = NO_ERROR;
    IPalObject *pFileObject = NULL;
    CFileProcessLocalData *pLocalData = NULL;
    IDataLock *pLocalDataLock = NULL;

    struct stat stat_data;

    if (INVALID_HANDLE_VALUE == hFile)
    {
        ERROR( "Invalid file handle\n" );
        palError = ERROR_INVALID_HANDLE;
        goto InternalGetFileTypeExit;
    }

    palError = g_pObjectManager->ReferenceObjectByHandle(
        pThread,
        hFile,
        &aotFile,
        GENERIC_READ,
        &pFileObject
        );

    if (NO_ERROR != palError)
    {
        goto InternalGetFileTypeExit;
    }
    
    palError = pFileObject->GetProcessLocalData(
        pThread,
        ReadLock, 
        &pLocalDataLock,
        reinterpret_cast<void**>(&pLocalData)
        );

    if (NO_ERROR != palError)
    {
        goto InternalGetFileTypeExit;
    }

    if (pLocalData->open_flags_deviceaccessonly == TRUE)
    {
        ERROR("File open for device access only\n");
        palError = ERROR_ACCESS_DENIED;
        goto InternalGetFileTypeExit;
    }

    if (fstat(pLocalData->unix_fd, &stat_data) != 0)
    {
        ERROR("fstat failed of file descriptor %d\n", pLocalData->unix_fd);
        palError = FILEGetLastErrorFromErrno();
        goto InternalGetFileTypeExit;
    }

    TRACE("st_mode & S_IFMT = %#x\n", stat_data.st_mode & S_IFMT);
    if (S_ISREG(stat_data.st_mode) || S_ISDIR(stat_data.st_mode))
    {
        *pdwFileType = FILE_TYPE_DISK;
    }
    else if (S_ISCHR(stat_data.st_mode))
    {
        *pdwFileType = FILE_TYPE_CHAR;
    }
    else if (S_ISFIFO(stat_data.st_mode))
    {
        *pdwFileType = FILE_TYPE_PIPE;
    }
    else
    {
        *pdwFileType = FILE_TYPE_UNKNOWN;
    }
    

InternalGetFileTypeExit:

    if (NULL != pLocalDataLock)
    {
        pLocalDataLock->ReleaseLock(pThread, FALSE);
    }

    if (NULL != pFileObject)
    {
        pFileObject->ReleaseReference(pThread);
    }

    return palError;

}